

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O2

void __thiscall HostUI::event(HostUI *this,SDL_Event *event)

{
  Uint32 UVar1;
  ImVec2 IVar2;
  char cVar3;
  int iVar4;
  ImGuiIO *pIVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int display_h;
  int display_w;
  int ih;
  int iw;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int iStack_34;
  undefined8 uStack_30;
  
  pIVar5 = ImGui::GetIO();
  UVar1 = event->type;
  if (UVar1 - 0x300 < 2) {
    pIVar5->KeysDown[(event->display).data1] = UVar1 == 0x300;
    uVar6 = SDL_GetModState();
    pIVar5->KeyShift = (uVar6 & 3) != 0;
    uVar6 = SDL_GetModState();
    pIVar5->KeyCtrl = (uVar6 & 0xc0) != 0;
    uVar6 = SDL_GetModState();
    pIVar5->KeyAlt = (uVar6 & 0x300) != 0;
    uVar6 = SDL_GetModState();
    pIVar5->KeySuper = (uVar6 & 0xc00) != 0;
  }
  else if (UVar1 == 0x403) {
    iVar4 = (event->window).data2;
    if (0 < iVar4) {
      this->mouse_wheel = 1.0;
      iVar4 = (event->window).data2;
    }
    if (iVar4 < 0) {
      this->mouse_wheel = -1.0;
    }
  }
  else {
    if (UVar1 == 0x303) {
      ImGuiIO::AddInputCharactersUTF8(pIVar5,(event->edit).text);
      return;
    }
    if (UVar1 == 0x401) {
      cVar3 = (event->edit).text[4];
      if (cVar3 == '\x01') {
        this->mouse_pressed[0] = 1.0;
        cVar3 = (event->edit).text[4];
      }
      if (cVar3 == '\x03') {
        this->mouse_pressed[1] = 1.0;
        cVar3 = (event->edit).text[4];
      }
      if (cVar3 == '\x02') {
        this->mouse_pressed[2] = 1.0;
      }
    }
    else if ((UVar1 == 0x200) &&
            (((event->display).event == '\x06' || ((event->display).event == '\x01')))) {
      pIVar5 = ImGui::GetIO();
      SDL_GetWindowSize(this->window,&local_3c,&local_40);
      local_38 = local_3c;
      iStack_34 = local_40;
      uStack_30 = 0;
      SDL_GL_GetDrawableSize(this->window,&local_44,&local_48);
      fVar7 = (float)local_38;
      fVar8 = (float)iStack_34;
      IVar2.y = fVar8;
      IVar2.x = fVar7;
      pIVar5->DisplaySize = IVar2;
      auVar10._0_4_ = (float)local_44;
      auVar10._4_4_ = (float)local_48;
      auVar10._8_8_ = 0;
      auVar11._4_4_ = fVar8;
      auVar11._0_4_ = fVar7;
      auVar11._8_4_ = (float)(int)uStack_30;
      auVar11._12_4_ = (float)uStack_30._4_4_;
      auVar11 = divps(auVar10,auVar11);
      IVar9.x = (float)(auVar11._0_4_ & -(uint)(0 < local_38));
      IVar9.y = (float)(auVar11._4_4_ & -(uint)(0 < iStack_34));
      pIVar5->DisplayFramebufferScale = IVar9;
      this->proj_matrix[4] = 0.0;
      this->proj_matrix[5] = 0.0;
      this->proj_matrix[0] = 0.0;
      this->proj_matrix[1] = 0.0;
      this->proj_matrix[2] = 0.0;
      this->proj_matrix[3] = 0.0;
      this->proj_matrix[0] = (f32)(2.0 / fVar7);
      this->proj_matrix[4] = (f32)(-2.0 / fVar8);
      this->proj_matrix[6] = -1.0;
      this->proj_matrix[7] = 1.0;
      this->proj_matrix[8] = 1.0;
    }
  }
  return;
}

Assistant:

void HostUI::event(union SDL_Event* event) {
  ImGuiIO& io = ImGui::GetIO();
  switch (event->type) {
    case SDL_WINDOWEVENT:
      switch (event->window.event) {
        case SDL_WINDOWEVENT_SHOWN:
        case SDL_WINDOWEVENT_SIZE_CHANGED: {
          ImGuiIO& io = ImGui::GetIO();

          int iw, ih;
          SDL_GetWindowSize(window, &iw, &ih);
          f32 w = iw, h = ih;
          int display_w, display_h;
          SDL_GL_GetDrawableSize(window, &display_w, &display_h);
          io.DisplaySize = ImVec2(w, h);
          io.DisplayFramebufferScale =
              ImVec2(w > 0 ? (display_w / w) : 0, h > 0 ? (display_h / h) : 0);

          memset(proj_matrix, 0, sizeof(proj_matrix));
          proj_matrix[0] = 2.0f / w;
          proj_matrix[4] = -2.0f / h;
          proj_matrix[6] = -1.0f;
          proj_matrix[7] = 1.0f;
          proj_matrix[8] = 1.0f;
          break;
        }
      }
      break;
    case SDL_MOUSEWHEEL:
      if (event->wheel.y > 0) mouse_wheel = 1;
      if (event->wheel.y < 0) mouse_wheel = -1;
      break;
    case SDL_MOUSEBUTTONDOWN:
      if (event->button.button == SDL_BUTTON_LEFT) mouse_pressed[0] = true;
      if (event->button.button == SDL_BUTTON_RIGHT) mouse_pressed[1] = true;
      if (event->button.button == SDL_BUTTON_MIDDLE) mouse_pressed[2] = true;
      break;
    case SDL_TEXTINPUT:
      io.AddInputCharactersUTF8(event->text.text);
      break;
    case SDL_KEYDOWN:
    case SDL_KEYUP: {
      int key = event->key.keysym.scancode;
      io.KeysDown[key] = (event->type == SDL_KEYDOWN);
      io.KeyShift = ((SDL_GetModState() & KMOD_SHIFT) != 0);
      io.KeyCtrl = ((SDL_GetModState() & KMOD_CTRL) != 0);
      io.KeyAlt = ((SDL_GetModState() & KMOD_ALT) != 0);
      io.KeySuper = ((SDL_GetModState() & KMOD_GUI) != 0);
      break;
    }
  }
}